

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_chunks.hpp
# Opt level: O1

iterator_range<burst::buffered_chunk_iterator<std::_List_const_iterator<char>,_int>_> * __thiscall
burst::buffered_chunks_t::operator()
          (iterator_range<burst::buffered_chunk_iterator<std::_List_const_iterator<char>,_int>_>
           *__return_storage_ptr__,buffered_chunks_t *this,list<char,_std::allocator<char>_> *args,
          int *args_1)

{
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int> begin;
  _List_node_base *local_a8;
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *pbStack_a0;
  difference_type local_98;
  element_type *peStack_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  buffer_value_type *pbStack_80;
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int> local_78;
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int> local_48;
  
  buffered_chunk_iterator<std::_List_const_iterator<char>,_int>::buffered_chunk_iterator
            (&local_48,
             (args->super__List_base<char,_std::allocator<char>_>)._M_impl._M_node.
             super__List_node_base._M_next,(_List_const_iterator<char>)args,*args_1);
  local_78.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_78.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_a8 = local_48.m_current._M_node;
  pbStack_a0 = (buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *)
               local_48.m_end._M_node;
  local_98 = local_48.m_chunk_size;
  peStack_90 = local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88 = local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  pbStack_80 = local_48.m_chunk_end;
  local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78.m_current._M_node = local_48.m_end._M_node;
  local_78.m_end._M_node = local_48.m_end._M_node;
  local_78.m_chunk_size = local_48.m_chunk_size;
  local_78.m_chunk_end =
       local_78.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  boost::make_iterator_range<burst::buffered_chunk_iterator<std::_List_const_iterator<char>,int>>
            (__return_storage_ptr__,(boost *)&local_a8,&local_78,
             (buffered_chunk_iterator<std::_List_const_iterator<char>,_int> *)local_48.m_end._M_node
            );
  if (local_78.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if (local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.m_chunk.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Args && ... args) const
        {
            auto begin = make_buffered_chunk_iterator(std::forward<Args>(args)...);
            auto end = make_buffered_chunk_iterator(iterator::end_tag, begin);

            return boost::make_iterator_range(std::move(begin), std::move(end));
        }